

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_mapper_test.cpp
# Opt level: O0

void __thiscall disp::h3(disp *this,string *s1,string *s2,string *s3)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  long in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  char in_stack_ffffffffffffff4f;
  string local_a0 [32];
  string local_80 [32];
  string local_60 [32];
  string local_40 [64];
  
  std::operator+(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff40);
  std::operator+(in_RCX,(char)((ulong)in_RDX >> 0x38));
  std::operator+(in_RCX,in_RDX);
  std::operator+(in_RCX,(char)((ulong)in_RDX >> 0x38));
  std::operator+(in_RCX,in_RDX);
  std::__cxx11::string::operator=((string *)(in_RDI + 0x28),local_40);
  std::__cxx11::string::~string(local_40);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string(local_80);
  std::__cxx11::string::~string(local_a0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff40);
  return;
}

Assistant:

void h3(std::string s1,std::string s2,std::string s3)
	{ v_ = ':'+s1+':'+s2+':'+s3; }